

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicizeCA(Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,int fCA)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __n;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  long lVar29;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar28;
  int iVar31;
  undefined1 auVar24 [16];
  long lVar30;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar32;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar33 [16];
  int iVar37;
  Abc_SccCost_t c;
  Abc_TgMan_t tgManCopy;
  Abc_TgMan_t tgMan;
  Abc_TgMan_t local_1b8;
  Abc_TgMan_t local_f0;
  
  bVar5 = (byte)nVars;
  uVar4 = 1 << (bVar5 - 6 & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  if (nVars == 0) {
    *pTruth = 0;
    uVar7 = 0;
  }
  else {
    if (nVars < 6) {
      uVar7 = 1 << (bVar5 & 0x1f);
      uVar21 = (ulong)uVar7;
      uVar11 = ~(-1L << ((byte)uVar7 & 0x3f)) & *pTruth;
      if ((uint)nVars < 6) {
        uVar9 = uVar7 * 2;
        uVar10 = (ulong)uVar9;
        uVar8 = 0x40;
        if (0x40 < uVar10) {
          uVar8 = uVar10;
        }
        uVar10 = ((uVar8 - uVar10) - (ulong)(nVars != 5) >> (bVar5 & 0x3f)) + (ulong)(nVars != 5);
        lVar29 = (ulong)uVar7 * 2;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar11;
        auVar17._8_4_ = (int)uVar10;
        auVar17._0_8_ = uVar10;
        auVar17._12_4_ = (int)(uVar10 >> 0x20);
        uVar8 = 0xfffffffffffffffe;
        do {
          auVar15 = auVar13;
          auVar23._8_4_ = (int)uVar11;
          auVar23._0_8_ = uVar11;
          auVar23._12_4_ = (int)(uVar11 >> 0x20);
          auVar14._8_8_ = auVar23._8_8_ << lVar29;
          auVar14._0_8_ = uVar11 << uVar21;
          auVar13 = auVar14 | auVar15;
          uVar21 = uVar21 + uVar9;
          lVar29 = lVar29 + (ulong)uVar9;
          uVar8 = uVar8 + 2;
        } while ((uVar10 & 0xfffffffffffffffe) != uVar8);
        auVar22._8_4_ = (int)uVar8;
        auVar22._0_8_ = uVar8;
        auVar22._12_4_ = (int)(uVar8 >> 0x20);
        auVar17 = auVar17 ^ _DAT_0093d220;
        auVar23 = (auVar22 | _DAT_0093d210) ^ _DAT_0093d220;
        iVar32 = -(uint)(auVar17._0_4_ < auVar23._0_4_);
        iVar34 = -(uint)(auVar17._4_4_ < auVar23._4_4_);
        iVar35 = -(uint)(auVar17._8_4_ < auVar23._8_4_);
        iVar36 = -(uint)(auVar17._12_4_ < auVar23._12_4_);
        iVar28 = -(uint)(auVar23._4_4_ == auVar17._4_4_);
        iVar31 = -(uint)(auVar23._12_4_ == auVar17._12_4_);
        auVar18._4_4_ = iVar28;
        auVar18._0_4_ = iVar28;
        auVar18._8_4_ = iVar31;
        auVar18._12_4_ = iVar31;
        auVar1._4_4_ = iVar32;
        auVar1._0_4_ = iVar32;
        auVar1._8_4_ = iVar35;
        auVar1._12_4_ = iVar35;
        auVar24._4_4_ = iVar34;
        auVar24._0_4_ = iVar34;
        auVar24._8_4_ = iVar36;
        auVar24._12_4_ = iVar36;
        auVar24 = auVar24 | auVar18 & auVar1;
        auVar13 = ~auVar24 & auVar13 | auVar15 & auVar24;
        uVar11 = auVar13._8_8_ | auVar13._0_8_;
      }
      if (*pTruth != uVar11) goto LAB_00504b58;
    }
    if (0 < (int)uVar4) {
      lVar29 = 0;
      do {
        *(undefined8 *)((long)gpVerCopy + lVar29) = *(undefined8 *)((long)pTruth + lVar29);
        lVar29 = lVar29 + 8;
      } while ((ulong)uVar4 << 3 != lVar29);
    }
    if (0x10 < nVars) {
      __assert_fail("nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0xa5b,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    if (p == (Abc_TtHieMan_t *)0x0) {
      __assert_fail("p != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0xa5c,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    iVar28 = Abc_TtHieRetrieveOrInsert(p,-5,pTruth,pTruth);
    uVar7 = 0x20000000;
    if (iVar28 < 1) {
      Abc_TgInitMan(&local_f0,pTruth,nVars,2,p->vPhase);
      Abc_TgCreateGroups(&local_f0);
      iVar28 = Abc_TtHieRetrieveOrInsert(p,-4,pTruth,pTruth);
      if (iVar28 < 1) {
        Abc_TgPurgeSymmetry(&local_f0,1);
        Abc_TgExpendSymmetry(&local_f0,pCanonPerm);
        Abc_TgImplementPerm(&local_f0,pCanonPerm);
        uVar9 = local_f0.uPhase;
        iVar28 = local_f0.nVars;
        __n = (size_t)local_f0.nVars;
        bVar5 = (byte)local_f0.nVars;
        uVar7 = 1 << (bVar5 - 6 & 0x1f);
        if ((long)__n < 7) {
          uVar7 = 1;
        }
        if ((long)__n < 6) {
          lVar29 = 1L << (bVar5 & 0x3f);
          uVar21 = ~(-1L << ((byte)lVar29 & 0x3f)) & *local_f0.pTruth;
          if ((uint)local_f0.nVars < 6) {
            uVar11 = 0x40;
            if (0x40 < (ulong)(lVar29 * 2)) {
              uVar11 = lVar29 * 2;
            }
            uVar8 = (uVar11 - ((ulong)(local_f0.nVars != 5) + lVar29 * 2) >> (bVar5 & 0x3f)) +
                    (ulong)(local_f0.nVars != 5);
            auVar33._8_4_ = (int)lVar29;
            auVar33._0_8_ = lVar29;
            auVar33._12_4_ = (int)((ulong)lVar29 >> 0x20);
            lVar6 = auVar33._8_8_ * 2;
            auVar25._8_4_ = (int)lVar6;
            auVar25._0_8_ = lVar29;
            auVar25._12_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar21;
            auVar19._8_4_ = (int)uVar8;
            auVar19._0_8_ = uVar8;
            auVar19._12_4_ = (int)(uVar8 >> 0x20);
            uVar11 = 0xfffffffffffffffe;
            do {
              auVar13 = auVar15;
              lVar30 = auVar25._8_8_;
              auVar2._8_4_ = (int)uVar21;
              auVar2._0_8_ = uVar21;
              auVar2._12_4_ = (int)(uVar21 >> 0x20);
              auVar16._8_8_ = auVar2._8_8_ << lVar30;
              auVar16._0_8_ = uVar21 << auVar25._0_8_;
              auVar15 = auVar16 | auVar13;
              auVar25._0_8_ = auVar25._0_8_ + lVar29 * 2;
              auVar25._8_8_ = lVar30 + lVar6;
              uVar11 = uVar11 + 2;
            } while ((uVar8 & 0xfffffffffffffffe) != uVar11);
            auVar26._8_4_ = (int)uVar11;
            auVar26._0_8_ = uVar11;
            auVar26._12_4_ = (int)(uVar11 >> 0x20);
            auVar19 = auVar19 ^ _DAT_0093d220;
            auVar17 = (auVar26 | _DAT_0093d210) ^ _DAT_0093d220;
            iVar34 = -(uint)(auVar19._0_4_ < auVar17._0_4_);
            iVar35 = -(uint)(auVar19._4_4_ < auVar17._4_4_);
            iVar36 = -(uint)(auVar19._8_4_ < auVar17._8_4_);
            iVar37 = -(uint)(auVar19._12_4_ < auVar17._12_4_);
            iVar31 = -(uint)(auVar17._4_4_ == auVar19._4_4_);
            iVar32 = -(uint)(auVar17._12_4_ == auVar19._12_4_);
            auVar20._4_4_ = iVar31;
            auVar20._0_4_ = iVar31;
            auVar20._8_4_ = iVar32;
            auVar20._12_4_ = iVar32;
            auVar3._4_4_ = iVar34;
            auVar3._0_4_ = iVar34;
            auVar3._8_4_ = iVar36;
            auVar3._12_4_ = iVar36;
            auVar27._4_4_ = iVar35;
            auVar27._0_4_ = iVar35;
            auVar27._8_4_ = iVar37;
            auVar27._12_4_ = iVar37;
            auVar27 = auVar27 | auVar20 & auVar3;
            auVar13 = ~auVar27 & auVar15 | auVar13 & auVar27;
            uVar21 = auVar13._8_8_ | auVar13._0_8_;
          }
          if (*local_f0.pTruth != uVar21) {
LAB_00504b58:
            __assert_fail("*pTruth == nTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                          ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
          }
        }
        if ((int)uVar7 < 1) {
          memcpy(&local_1b8,local_f0.pPermT,__n);
          Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,iVar28,(char *)&local_1b8,uVar9);
        }
        else {
          lVar29 = 0;
          do {
            *(undefined8 *)((long)&Abc_TtCannonVerify_pCopy2 + lVar29) =
                 *(undefined8 *)((long)local_f0.pTruth + lVar29);
            lVar29 = lVar29 + 8;
          } while ((ulong)uVar7 << 3 != lVar29);
          memcpy(&local_1b8,local_f0.pPermT,__n);
          Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,iVar28,(char *)&local_1b8,uVar9);
          lVar29 = 0;
          do {
            if (*(long *)((long)gpVerCopy + lVar29) !=
                *(long *)((long)&Abc_TtCannonVerify_pCopy2 + lVar29)) {
              __assert_fail("Abc_TgCannonVerify(&tgMan)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                            ,0xa66,
                            "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                           );
            }
            lVar29 = lVar29 + 8;
          } while ((ulong)uVar7 << 3 != lVar29);
        }
        uVar7 = 0x20000000;
        iVar28 = Abc_TtHieRetrieveOrInsert(p,-3,pTruth,pTruth);
        if (iVar28 < 1) {
          memcpy(&local_1b8,&local_f0,0xc0);
          uVar9 = 1 << ((char)local_f0.nVars - 6U & 0x1f);
          if (local_f0.nVars < 7) {
            uVar9 = 1;
          }
          if (0 < (int)uVar9) {
            lVar29 = 0;
            do {
              *(undefined8 *)((long)Abc_TtCanonicizeCA::pCopy + lVar29) =
                   *(undefined8 *)((long)local_f0.pTruth + lVar29);
              lVar29 = lVar29 + 8;
            } while ((ulong)uVar9 << 3 != lVar29);
          }
          local_1b8.pTruth = Abc_TtCanonicizeCA::pCopy;
          Abc_TgSimpleEnumeration(&local_f0);
          iVar28 = Abc_TtHieRetrieveOrInsert(p,-2,pTruth,pTruth);
          if (iVar28 < 1) {
            memcpy(&local_f0,&local_1b8,0xc0);
            uVar7 = 1 << ((char)local_1b8.nVars - 6U & 0x1f);
            if (local_1b8.nVars < 7) {
              uVar7 = 1;
            }
            if (0 < (int)uVar7) {
              lVar29 = 0;
              do {
                *(undefined8 *)((long)pTruth + lVar29) =
                     *(undefined8 *)((long)Abc_TtCanonicizeCA::pCopy + lVar29);
                lVar29 = lVar29 + 8;
              } while ((ulong)uVar7 << 3 != lVar29);
            }
            local_f0.pTruth = pTruth;
            if (0 < (int)uVar4) {
              memset(pTruth,0xff,(ulong)uVar4 << 3);
            }
            iVar28 = Abc_TgCannonVerify(&local_1b8);
            if (iVar28 == 0) {
              __assert_fail("Abc_TgCannonVerify(&tgManCopy)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                            ,0xa6f,
                            "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                           );
            }
            c = Abc_TgRecordPhase(&local_1b8,0);
            uVar7 = 0;
            if ((fCA != 0) &&
               (dVar12 = Abc_SccEnumCost(&local_1b8,c), uVar7 = 0,
               (double)local_1b8.nVars * 0.997 + (double)local_1b8.nGVars * 1.043 + -15.9 < dVar12))
            {
              Abc_TgResetGroup(&local_1b8);
              Abc_TgRecordPhase(&local_1b8,1);
              uVar7 = 0x10000000;
            }
            Abc_TgFullEnumeration(&local_1b8,&local_f0);
            Abc_TtHieRetrieveOrInsert(p,-1,pTruth,pTruth);
            memcpy(pCanonPerm,local_f0.pPermT,(long)nVars);
            iVar28 = Abc_TgCannonVerify(&local_f0);
            if (iVar28 == 0) {
              puts("Canonical form verification failed!");
            }
            uVar7 = uVar7 | local_f0.uPhase;
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int fCA)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned fHard = 0, fHash = 1 << 29;
    static word pCopy[1024];
    Abc_TgMan_t tgMan, tgManCopy;
    Abc_SccCost_t sc;

    // handle constant
    if (nVars == 0) {
        Abc_TtClear(pTruth, nWords);
        return 0;
    }

    Abc_TtVerifySmallTruth(pTruth, nVars);
#ifdef CANON_VERIFY
    Abc_TtCopy(gpVerCopy, pTruth, nWords, 0);
#endif

    assert(nVars <= 16);
    assert(p != NULL);
    if (Abc_TtHieRetrieveOrInsert(p, -5, pTruth, pTruth) > 0) return fHash;
    Abc_TgInitMan(&tgMan, pTruth, nVars, 2, p->vPhase);

    Abc_TgCreateGroups(&tgMan);
    if (p && Abc_TtHieRetrieveOrInsert(p, -4, pTruth, pTruth) > 0) return fHash;
    Abc_TgPurgeSymmetry(&tgMan, 1);

    Abc_TgExpendSymmetry(&tgMan, pCanonPerm);
    Abc_TgImplementPerm(&tgMan, pCanonPerm);
    assert(Abc_TgCannonVerify(&tgMan));

    if (Abc_TtHieRetrieveOrInsert(p, -3, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgManCopy, pCopy, &tgMan);
    Abc_TgSimpleEnumeration(&tgMan);
    if (Abc_TtHieRetrieveOrInsert(p, -2, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgMan, pTruth, &tgManCopy);
    Abc_TtFill(pTruth, nWords);

    assert(Abc_TgCannonVerify(&tgManCopy));
    sc = Abc_TgRecordPhase(&tgManCopy, 0);
    if (fCA && Abc_SccEnumCost(&tgManCopy, sc) > Abc_SccPhaseCost(&tgManCopy))
    {
        Abc_TgResetGroup(&tgManCopy);
        sc = Abc_TgRecordPhase(&tgManCopy, 1);
        fHard = 1 << 28;
    }
    Abc_TgFullEnumeration(&tgManCopy, &tgMan);
    Abc_TtHieRetrieveOrInsert(p, -1, pTruth, pTruth);
    memcpy(pCanonPerm, tgMan.pPermT, sizeof(char) * nVars);

#ifdef CANON_VERIFY
    if (!Abc_TgCannonVerify(&tgMan))
        printf("Canonical form verification failed!\n");
#endif
    return tgMan.uPhase | fHard;
}